

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_eq_h(target_ulong_conflict r1,target_ulong_conflict r2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar2 = 0xffff;
  if ((short)(r1 ^ r2) != 0) {
    uVar2 = 0;
  }
  uVar1 = uVar2 - 0x10000;
  if (0xffff < (r1 ^ r2)) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

uint32_t helper_eq_h(target_ulong r1, target_ulong r2)
{
    int32_t ret = 0;

    if ((r1 & 0xffff) == (r2 & 0xffff)) {
        ret = 0xffff;
    }

    if ((r1 & 0xffff0000) == (r2 & 0xffff0000)) {
        ret |= 0xffff0000;
    }

    return ret;
}